

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cpp
# Opt level: O0

void ncnn_net_register_custom_layer_by_typeindex
               (ncnn_net_t net,int typeindex,ncnn_layer_creator_t creator,
               ncnn_layer_destroyer_t destroyer,void *userdata)

{
  undefined8 *puVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RDI;
  undefined8 in_R8;
  ncnn_net_custom_layer_factory_t_conflict ud;
  undefined4 in_stack_00000028;
  
  puVar1 = (undefined8 *)malloc(0x20);
  *puVar1 = in_RDX;
  puVar1[1] = in_RCX;
  puVar1[2] = in_R8;
  puVar1[3] = *(undefined8 *)(in_RDI + 8);
  *(undefined8 **)(in_RDI + 8) = puVar1;
  ncnn::Net::register_custom_layer
            ((Net *)CONCAT44(typeindex,in_stack_00000028),creator._4_4_,
             (layer_creator_func)destroyer,(layer_destroyer_func)userdata,ud);
  return;
}

Assistant:

void ncnn_net_register_custom_layer_by_typeindex(ncnn_net_t net, int typeindex, ncnn_layer_creator_t creator, ncnn_layer_destroyer_t destroyer, void* userdata)
{
    ncnn_net_custom_layer_factory_t ud = (ncnn_net_custom_layer_factory_t)malloc(sizeof(struct __ncnn_net_custom_layer_factory_t));
    ud->creator = creator;
    ud->destroyer = destroyer;
    ud->userdata = userdata;
    ud->next = net->custom_layer_factory;
    net->custom_layer_factory = ud;
    ((Net*)net->pthis)->register_custom_layer(typeindex, __Layer_c_api_layer_creator, __Layer_c_api_layer_destroyer, (void*)ud);
}